

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O0

void __thiscall CNet::SetState(CNet *this,int iState)

{
  int iState_local;
  CNet *this_local;
  
  if (iState == 1) {
    (this->super_CObject).m_iState = (this->super_CObject).m_iState & 0xfffffffd;
    (this->super_CObject).m_iState = (this->super_CObject).m_iState | 1;
  }
  else if (iState == 2) {
    (this->super_CObject).m_iState = (this->super_CObject).m_iState & 0xfffffffe;
    (this->super_CObject).m_iState = (this->super_CObject).m_iState | 2;
  }
  else if (iState == 0x10) {
    (this->super_CObject).m_iState = (this->super_CObject).m_iState | 0x10;
    (this->super_CObject).m_iState = (this->super_CObject).m_iState & 0xffffffdf;
  }
  else if (iState == 0x20) {
    (this->super_CObject).m_iState = (this->super_CObject).m_iState | 0x20;
    (this->super_CObject).m_iState = (this->super_CObject).m_iState & 0xffffffef;
  }
  else {
    if (iState != 0x40) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                    ,0x24e,"void CNet::SetState(int)");
    }
    (this->super_CObject).m_iState = (this->super_CObject).m_iState | 0x40;
  }
  return;
}

Assistant:

void CNet::SetState(int iState)
{
	switch(iState) {
	case STATE_NET_PREROUTED:
		m_iState	|=	STATE_NET_PREROUTED;
		break;
	//case STATE_NET_REROUTED:
	//	m_iState	&=	~STATE_NET_UNREROUTED;	
	//	m_iState	|=	STATE_NET_REROUTED;
	//	break;
	//case STATE_NET_UNREROUTED:
	//	m_iState	&=	~STATE_NET_REROUTED;	
	//	m_iState	|=	STATE_NET_UNREROUTED;
	//	break;		
	case STATE_NET_ROUTED:
		m_iState	&=	~STATE_NET_UNROUTED;	
		m_iState	|=	STATE_NET_ROUTED;
		break;
	case STATE_NET_UNROUTED:
		m_iState	&=	~STATE_NET_ROUTED;	
		m_iState	|=	STATE_NET_UNROUTED;
		break;
	case STATE_NET_BBOXDIRTY:
		m_iState	|=	STATE_NET_BBOXDIRTY;
		m_iState	&=	~STATE_NET_BBOXCLEAN;
		break;
	case STATE_NET_BBOXCLEAN:
		m_iState	|=	STATE_NET_BBOXCLEAN;
		m_iState	&=	~STATE_NET_BBOXDIRTY;
		break;
	default:
		assert(false);
		break;
	}
}